

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O0

wchar_t do_unstore_file(archive_read *a,rar5 *rar,void **buf,size_t *size,int64_t *offset)

{
  wchar_t wVar1;
  uint8_t *local_58;
  uint8_t *puStack_48;
  wchar_t ret;
  uint8_t *p;
  size_t to_read;
  int64_t *offset_local;
  size_t *size_local;
  void **buf_local;
  rar5 *rar_local;
  archive_read *a_local;
  
  to_read = (size_t)offset;
  offset_local = (int64_t *)size;
  size_local = (size_t *)buf;
  buf_local = (void **)rar;
  rar_local = (rar5 *)a;
  if ((((rar->file).bytes_remaining == 0) && ((*(byte *)&rar->main >> 1 & 1) != 0)) &&
     ((undefined1  [12])((undefined1  [12])rar->generic & (undefined1  [12])0x1) !=
      (undefined1  [12])0x0)) {
    *(byte *)&rar->cstate = *(byte *)&rar->cstate & 0xfb | 4;
    wVar1 = advance_multivolume(a);
    *(byte *)(buf_local + 7) = *(byte *)(buf_local + 7) & 0xfb;
    if (wVar1 != L'\0') {
      return wVar1;
    }
  }
  if ((long)buf_local[0x975] < 0x10001) {
    local_58 = (uint8_t *)buf_local[0x975];
  }
  else {
    local_58 = (uint8_t *)0x10000;
  }
  p = local_58;
  if (local_58 == (uint8_t *)0x0) {
    a_local._4_4_ = L'\x01';
  }
  else {
    wVar1 = read_ahead((archive_read *)rar_local,(size_t)local_58,&stack0xffffffffffffffb8);
    if (wVar1 == L'\0') {
      archive_set_error((archive *)rar_local,0x54,"I/O error when unstoring file");
      a_local._4_4_ = L'\xffffffe2';
    }
    else {
      wVar1 = consume((archive_read *)rar_local,(int64_t)p);
      if (wVar1 == L'\0') {
        if (size_local != (size_t *)0x0) {
          *size_local = (size_t)puStack_48;
        }
        if (offset_local != (int64_t *)0x0) {
          *offset_local = (int64_t)p;
        }
        if (to_read != 0) {
          *(void **)to_read = buf_local[0x10];
        }
        buf_local[0x975] = (void *)((long)buf_local[0x975] - (long)p);
        buf_local[0x10] = p + (long)buf_local[0x10];
        update_crc((rar5 *)buf_local,puStack_48,(size_t)p);
        a_local._4_4_ = L'\0';
      }
      else {
        a_local._4_4_ = L'\x01';
      }
    }
  }
  return a_local._4_4_;
}

Assistant:

static int do_unstore_file(struct archive_read* a,
    struct rar5* rar, const void** buf, size_t* size, int64_t* offset)
{
	size_t to_read;
	const uint8_t* p;

	if(rar->file.bytes_remaining == 0 && rar->main.volume > 0 &&
	    rar->generic.split_after > 0)
	{
		int ret;

		rar->cstate.switch_multivolume = 1;
		ret = advance_multivolume(a);
		rar->cstate.switch_multivolume = 0;

		if(ret != ARCHIVE_OK) {
			/* Failed to advance to next multivolume archive
			 * file. */
			return ret;
		}
	}

	to_read = rar5_min(rar->file.bytes_remaining, 64 * 1024);
	if(to_read == 0) {
		return ARCHIVE_EOF;
	}

	if(!read_ahead(a, to_read, &p)) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "I/O error when unstoring file");
		return ARCHIVE_FATAL;
	}

	if(ARCHIVE_OK != consume(a, to_read)) {
		return ARCHIVE_EOF;
	}

	if(buf)    *buf = p;
	if(size)   *size = to_read;
	if(offset) *offset = rar->cstate.last_unstore_ptr;

	rar->file.bytes_remaining -= to_read;
	rar->cstate.last_unstore_ptr += to_read;

	update_crc(rar, p, to_read);
	return ARCHIVE_OK;
}